

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadTypeSection(BinaryReader *this,Offset section_size)

{
  BinaryReaderDelegate *pBVar1;
  bool bVar2;
  Result RVar3;
  Enum EVar4;
  char *pcVar5;
  reference pvVar6;
  reference out_value;
  size_type sVar7;
  TypeMut *pTVar8;
  Type *local_120;
  Type *local_118;
  byte local_e0;
  undefined1 local_c4 [8];
  TypeMut field;
  uint local_b0;
  Index j_2;
  Enum local_a4;
  Index num_fields;
  Type *result_types;
  Type *param_types;
  Enum local_88;
  Type local_84;
  Type result_type;
  Index j_1;
  Type TStack_70;
  Index num_results;
  Enum local_68;
  Type local_64;
  Type param_type;
  Index j;
  Type TStack_50;
  Index num_params;
  Enum local_48;
  byte local_41;
  Enum local_40;
  uint8_t type;
  Type TStack_3c;
  Type form;
  Index i;
  Enum local_28;
  Enum local_24;
  Index num_signatures;
  Offset section_size_local;
  BinaryReader *this_local;
  
  _num_signatures = section_size;
  section_size_local = (Offset)this;
  local_24 = (*this->delegate_->_vptr_BinaryReaderDelegate[9])(this->delegate_,section_size);
  bVar2 = Succeeded((Result)local_24);
  if (bVar2) {
    RVar3 = ReadCount(this,(Index *)&local_28,"type count");
    bVar2 = Failed(RVar3);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      form.type_index_ = (*this->delegate_->_vptr_BinaryReaderDelegate[10])();
      bVar2 = Succeeded((Result)form.type_index_);
      if (bVar2) {
        for (form.enum_ = Any; (uint)form.enum_ < (uint)local_28; form.enum_ = form.enum_ + ~I64) {
          bVar2 = Features::gc_enabled(&this->options_->features);
          if (bVar2) {
            local_40 = (Enum)ReadType(this,&stack0xffffffffffffffc4,"type form");
            bVar2 = Failed((Result)local_40);
            if (bVar2) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
          }
          else {
            local_48 = (Enum)ReadU8(this,&local_41,"type form");
            bVar2 = Failed((Result)local_48);
            if (bVar2) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            if (local_41 != 0x60) {
              PrintError(this,"unexpected type form (got %#x)",(ulong)local_41);
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            Type::Type(&stack0xffffffffffffffb0,Func);
            TStack_3c = TStack_50;
          }
          EVar4 = Type::operator_cast_to_Enum(&stack0xffffffffffffffc4);
          if (EVar4 == Array) {
            bVar2 = Features::gc_enabled(&this->options_->features);
            if (!bVar2) {
              PrintError(this,"invalid type form: array not allowed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            RVar3 = ReadField(this,(TypeMut *)local_c4);
            bVar2 = Failed(RVar3);
            if (bVar2) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            local_e0 = (byte)field.type.enum_;
            RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd])
                                    (this->delegate_,(ulong)(uint)form.enum_,local_c4,
                                     (ulong)local_e0);
            bVar2 = Succeeded(RVar3);
            if (!bVar2) {
              PrintError(this,"OnArrayType callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
          }
          else if (EVar4 == Struct) {
            bVar2 = Features::gc_enabled(&this->options_->features);
            if (!bVar2) {
              PrintError(this,"invalid type form: struct not allowed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            RVar3 = ReadCount(this,&j_2,"field count");
            bVar2 = Failed(RVar3);
            if (bVar2) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::resize
                      (&this->fields_,(ulong)j_2);
            for (local_b0 = 0; EVar4 = form.enum_, local_b0 < j_2; local_b0 = local_b0 + 1) {
              out_value = std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::operator[]
                                    (&this->fields_,(ulong)local_b0);
              field._8_4_ = ReadField(this,out_value);
              bVar2 = Failed((Result)field._8_4_);
              if (bVar2) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
            }
            pBVar1 = this->delegate_;
            sVar7 = std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::size(&this->fields_)
            ;
            pTVar8 = std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::data
                               (&this->fields_);
            field.type.type_index_ =
                 (*pBVar1->_vptr_BinaryReaderDelegate[0xc])
                           (pBVar1,(ulong)(uint)EVar4,sVar7 & 0xffffffff,pTVar8);
            bVar2 = Succeeded((Result)field.type.type_index_);
            if (!bVar2) {
              PrintError(this,"OnStructType callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
          }
          else {
            if (EVar4 != Func) {
              EVar4 = Type::operator_cast_to_Enum(&stack0xffffffffffffffc4);
              pcVar5 = "";
              if (EVar4 < Any) {
                pcVar5 = "-";
              }
              EVar4 = Type::operator_cast_to_Enum(&stack0xffffffffffffffc4);
              if (EVar4 < ~I64) {
                EVar4 = -EVar4;
              }
              PrintError(this,"unexpected type form (got %s%#x)",pcVar5,(ulong)(uint)EVar4);
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            param_type.type_index_ = (Index)ReadCount(this,&j,"function param count");
            bVar2 = Failed((Result)param_type.type_index_);
            if (bVar2) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            std::vector<wabt::Type,_std::allocator<wabt::Type>_>::resize
                      (&this->param_types_,(ulong)j);
            for (param_type.enum_ = Any; (uint)param_type.enum_ < j;
                param_type.enum_ = param_type.enum_ + ~I64) {
              local_68 = (Enum)ReadType(this,&local_64,"function param type");
              bVar2 = Failed((Result)local_68);
              if (bVar2) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              TStack_70 = local_64;
              bVar2 = IsConcreteType(this,local_64);
              if (!bVar2) {
                EVar4 = Type::operator_cast_to_Enum(&local_64);
                pcVar5 = "";
                if (EVar4 < Any) {
                  pcVar5 = "-";
                }
                EVar4 = Type::operator_cast_to_Enum(&local_64);
                if (EVar4 < ~I64) {
                  EVar4 = -EVar4;
                }
                PrintError(this,"expected valid param type (got %s%#x)",pcVar5,(ulong)(uint)EVar4);
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              pvVar6 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                                 (&this->param_types_,(ulong)(uint)param_type.enum_);
              pvVar6->enum_ = local_64.enum_;
              pvVar6->type_index_ = local_64.type_index_;
            }
            result_type.type_index_ = (Index)ReadCount(this,&j_1,"function result count");
            bVar2 = Failed((Result)result_type.type_index_);
            if (bVar2) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            std::vector<wabt::Type,_std::allocator<wabt::Type>_>::resize
                      (&this->result_types_,(ulong)j_1);
            for (result_type.enum_ = Any; (uint)result_type.enum_ < j_1;
                result_type.enum_ = result_type.enum_ + ~I64) {
              local_88 = (Enum)ReadType(this,&local_84,"function result type");
              bVar2 = Failed((Result)local_88);
              if (bVar2) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              param_types = (Type *)local_84;
              bVar2 = IsConcreteType(this,local_84);
              if (!bVar2) {
                EVar4 = Type::operator_cast_to_Enum(&local_84);
                pcVar5 = "";
                if (EVar4 < Any) {
                  pcVar5 = "-";
                }
                EVar4 = Type::operator_cast_to_Enum(&local_84);
                if (EVar4 < ~I64) {
                  EVar4 = -EVar4;
                }
                PrintError(this,"expected valid result type (got %s%#x)",pcVar5,(ulong)(uint)EVar4);
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              pvVar6 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                                 (&this->result_types_,(ulong)(uint)result_type.enum_);
              pvVar6->enum_ = local_84.enum_;
              pvVar6->type_index_ = local_84.type_index_;
            }
            if (j == 0) {
              local_118 = (Type *)0x0;
            }
            else {
              local_118 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::data
                                    (&this->param_types_);
            }
            result_types = local_118;
            if (j_1 == 0) {
              local_120 = (Type *)0x0;
            }
            else {
              local_120 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::data
                                    (&this->result_types_);
            }
            _num_fields = local_120;
            local_a4 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb])
                                 (this->delegate_,(ulong)(uint)form.enum_,(ulong)j,result_types,
                                  (ulong)j_1,local_120);
            bVar2 = Succeeded((Result)local_a4);
            if (!bVar2) {
              PrintError(this,"OnFuncType callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
          }
        }
        RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xe])();
        bVar2 = Succeeded(RVar3);
        if (bVar2) {
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
        else {
          PrintError(this,"EndTypeSection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"OnTypeCount callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
  }
  else {
    PrintError(this,"BeginTypeSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadTypeSection(Offset section_size) {
  CALLBACK(BeginTypeSection, section_size);
  Index num_signatures;
  CHECK_RESULT(ReadCount(&num_signatures, "type count"));
  CALLBACK(OnTypeCount, num_signatures);

  for (Index i = 0; i < num_signatures; ++i) {
    Type form;
    if (options_.features.gc_enabled()) {
      CHECK_RESULT(ReadType(&form, "type form"));
    } else {
      uint8_t type;
      CHECK_RESULT(ReadU8(&type, "type form"));
      ERROR_UNLESS(type == 0x60, "unexpected type form (got %#x)", type);
      form = Type::Func;
    }

    switch (form) {
      case Type::Func: {
        Index num_params;
        CHECK_RESULT(ReadCount(&num_params, "function param count"));

        param_types_.resize(num_params);

        for (Index j = 0; j < num_params; ++j) {
          Type param_type;
          CHECK_RESULT(ReadType(&param_type, "function param type"));
          ERROR_UNLESS(IsConcreteType(param_type),
                       "expected valid param type (got " PRItypecode ")",
                       WABT_PRINTF_TYPE_CODE(param_type));
          param_types_[j] = param_type;
        }

        Index num_results;
        CHECK_RESULT(ReadCount(&num_results, "function result count"));

        result_types_.resize(num_results);

        for (Index j = 0; j < num_results; ++j) {
          Type result_type;
          CHECK_RESULT(ReadType(&result_type, "function result type"));
          ERROR_UNLESS(IsConcreteType(result_type),
                       "expected valid result type (got " PRItypecode ")",
                       WABT_PRINTF_TYPE_CODE(result_type));
          result_types_[j] = result_type;
        }

        Type* param_types = num_params ? param_types_.data() : nullptr;
        Type* result_types = num_results ? result_types_.data() : nullptr;

        CALLBACK(OnFuncType, i, num_params, param_types, num_results,
                 result_types);
        break;
      }

      case Type::Struct: {
        ERROR_UNLESS(options_.features.gc_enabled(),
                     "invalid type form: struct not allowed");
        Index num_fields;
        CHECK_RESULT(ReadCount(&num_fields, "field count"));

        fields_.resize(num_fields);
        for (Index j = 0; j < num_fields; ++j) {
          CHECK_RESULT(ReadField(&fields_[j]));
        }

        CALLBACK(OnStructType, i, fields_.size(), fields_.data());
        break;
      }

      case Type::Array: {
        ERROR_UNLESS(options_.features.gc_enabled(),
                     "invalid type form: array not allowed");

        TypeMut field;
        CHECK_RESULT(ReadField(&field));
        CALLBACK(OnArrayType, i, field);
        break;
      };

      default:
        PrintError("unexpected type form (got " PRItypecode ")",
                   WABT_PRINTF_TYPE_CODE(form));
        return Result::Error;
    }
  }
  CALLBACK0(EndTypeSection);
  return Result::Ok;
}